

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::TaskSet::Task::Task(Task *this,OwnPromiseNode *nodeParam,TaskSet *taskSet)

{
  PromiseNode *pPVar1;
  
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_005979e8;
  (this->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
  kj::_::Event::Event(&this->super_Event,taskSet->location);
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00597a00;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_00597a28;
  (this->next).ptr.ptr = (Task *)0x0;
  this->prev = (Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *)0x0;
  this->taskSet = taskSet;
  (this->node).ptr = nodeParam->ptr;
  nodeParam->ptr = (PromiseNode *)0x0;
  pPVar1 = (this->node).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar1,&this->node);
  pPVar1 = (this->node).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,&this->super_Event);
  return;
}

Assistant:

Task(_::OwnPromiseNode&& nodeParam, TaskSet& taskSet)
      : Event(taskSet.location), taskSet(taskSet), node(kj::mv(nodeParam)) {
    node->setSelfPointer(&node);
    node->onReady(this);
  }